

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_info.cpp
# Opt level: O0

ostream * CMU462::Collada::operator<<(ostream *os,LightInfo *light)

{
  ostream *poVar1;
  LightInfo *light_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"LightInfo: ");
  poVar1 = std::operator<<(poVar1,(string *)&(light->super_Instance).name);
  poVar1 = std::operator<<(poVar1," (id:");
  poVar1 = std::operator<<(poVar1,(string *)&(light->super_Instance).id);
  std::operator<<(poVar1,")");
  std::operator<<(os," [");
  switch(light->light_type) {
  case NONE:
    std::operator<<(os,"type=none");
  case AMBIENT:
    poVar1 = std::operator<<(os," type=ambient");
    poVar1 = std::operator<<(poVar1," spectrum=");
    CMU462::operator<<(poVar1,&light->spectrum);
    break;
  case DIRECTIONAL:
    poVar1 = std::operator<<(os," type=directional");
    poVar1 = std::operator<<(poVar1," spectrum=");
    poVar1 = CMU462::operator<<(poVar1,&light->spectrum);
    poVar1 = std::operator<<(poVar1," direction=");
    CMU462::operator<<(poVar1,&light->direction);
    break;
  case AREA:
    poVar1 = std::operator<<(os," type=area");
    poVar1 = std::operator<<(poVar1," spectrum=");
    poVar1 = CMU462::operator<<(poVar1,&light->spectrum);
    poVar1 = std::operator<<(poVar1," direction=");
    CMU462::operator<<(poVar1,&light->direction);
    break;
  case POINT:
    poVar1 = std::operator<<(os," type=point");
    poVar1 = std::operator<<(poVar1," spectrum=");
    poVar1 = CMU462::operator<<(poVar1,&light->spectrum);
    poVar1 = std::operator<<(poVar1," position=");
    poVar1 = CMU462::operator<<(poVar1,&light->position);
    poVar1 = std::operator<<(poVar1," constant_att=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,light->constant_att);
    poVar1 = std::operator<<(poVar1," linear_att=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,light->linear_att);
    poVar1 = std::operator<<(poVar1," quadratic_att=");
    std::ostream::operator<<(poVar1,light->quadratic_att);
    break;
  case SPOT:
    poVar1 = std::operator<<(os," type=spot");
    poVar1 = std::operator<<(poVar1," spectrum=");
    poVar1 = CMU462::operator<<(poVar1,&light->spectrum);
    poVar1 = std::operator<<(poVar1," position=");
    poVar1 = CMU462::operator<<(poVar1,&light->position);
    poVar1 = std::operator<<(poVar1," direction=");
    poVar1 = CMU462::operator<<(poVar1,&light->direction);
    poVar1 = std::operator<<(poVar1," falloff_deg=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,light->falloff_deg);
    poVar1 = std::operator<<(poVar1," falloff_exp=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,light->falloff_exp);
    poVar1 = std::operator<<(poVar1," constant_att=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,light->constant_att);
    poVar1 = std::operator<<(poVar1," linear_att=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,light->linear_att);
    poVar1 = std::operator<<(poVar1," quadratic_att=");
    std::ostream::operator<<(poVar1,light->quadratic_att);
  }
  std::operator<<(os," ]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const LightInfo& light) {

  os << "LightInfo: " << light.name << " (id:" << light.id << ")";

  os << " [";

    switch (light.light_type) {
      case LightType::NONE:
        os << "type=none";
      case LightType::AMBIENT:
        os << " type=ambient"
           << " spectrum=" << light.spectrum;
        break;
      case LightType::DIRECTIONAL:
        os << " type=directional"
           << " spectrum=" << light.spectrum
           << " direction=" << light.direction;
        break;
      case LightType::AREA:
        os << " type=area"
           << " spectrum=" << light.spectrum
           << " direction=" << light.direction;
        break;
      case LightType::POINT:
        os << " type=point"
           << " spectrum=" << light.spectrum
           << " position="  << light.position
           << " constant_att="  << light.constant_att
           << " linear_att="    << light.linear_att
           << " quadratic_att=" << light.quadratic_att;
        break;
      case LightType::SPOT:
        os << " type=spot"
           << " spectrum=" << light.spectrum
           << " position="  << light.position
           << " direction=" << light.direction
           << " falloff_deg=" << light.falloff_deg
           << " falloff_exp=" << light.falloff_exp
           << " constant_att="  << light.constant_att
           << " linear_att="    << light.linear_att
           << " quadratic_att=" << light.quadratic_att;
        break;
    }

  os << " ]";

  return os;
}